

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O3

qint64 __thiscall QHttpPartPrivate::readData(QHttpPartPrivate *this,char *data,qint64 maxSize)

{
  long lVar1;
  long lVar2;
  size_t __n;
  size_t __n_00;
  char *pcVar3;
  size_t sVar4;
  
  checkHeaderCreated(this);
  lVar1 = (this->header).d.size;
  lVar2 = this->readPointer;
  __n_00 = lVar1 - lVar2;
  if (__n_00 == 0 || lVar1 < lVar2) {
    __n_00 = 0;
  }
  else {
    if (maxSize <= (long)__n_00) {
      __n_00 = maxSize;
    }
    pcVar3 = (this->header).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    memcpy(data,pcVar3 + lVar2,__n_00);
    lVar2 = this->readPointer + __n_00;
    this->readPointer = lVar2;
  }
  sVar4 = maxSize - __n_00;
  if (sVar4 != 0 && (long)__n_00 <= maxSize) {
    if (this->bodyDevice == (QIODevice *)0x0) {
      __n = ((this->body).d.size + lVar1) - lVar2;
      if ((long)sVar4 <= (long)__n) {
        __n = sVar4;
      }
      pcVar3 = (this->body).d.ptr;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)&QByteArray::_empty;
      }
      memcpy(data + __n_00,pcVar3 + (lVar2 - lVar1),__n);
    }
    else {
      __n = QIODevice::read((char *)this->bodyDevice,(longlong)(data + __n_00));
      if (__n == 0xffffffffffffffff) {
        return -1;
      }
    }
    __n_00 = __n_00 + __n;
    this->readPointer = this->readPointer + __n;
  }
  return __n_00;
}

Assistant:

qint64 QHttpPartPrivate::readData(char *data, qint64 maxSize)
{
    checkHeaderCreated();
    qint64 bytesRead = 0;
    qint64 headerDataCount = header.size();

    // read header if it has not been read yet
    if (readPointer < headerDataCount) {
        bytesRead = qMin(headerDataCount - readPointer, maxSize);
        const char *headerData = header.constData();
        memcpy(data, headerData + readPointer, bytesRead);
        readPointer += bytesRead;
    }
    // read content if there is still space
    if (bytesRead < maxSize) {
        if (bodyDevice) {
            qint64 dataBytesRead = bodyDevice->read(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
        } else {
            qint64 contentBytesRead = qMin(body.size() - readPointer + headerDataCount, maxSize - bytesRead);
            const char *contentData = body.constData();
            // if this method is called several times, we need to find the
            // right offset in the content ourselves:
            memcpy(data + bytesRead, contentData + readPointer - headerDataCount, contentBytesRead);
            bytesRead += contentBytesRead;
            readPointer += contentBytesRead;
        }
    }
    return bytesRead;
}